

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O1

void __thiscall
GrcManager::ConvertBetweenXYAndGpoint(GrcManager *this,GrcFont *pfont,gid16 wGlyphID)

{
  pointer *pppGVar1;
  GrcSymbolTableEntry *this_00;
  size_t sVar2;
  iterator iVar3;
  GrcGlyphAttrMatrix *pGVar4;
  size_t sVar5;
  size_t sVar6;
  gid16 gVar7;
  GrcFont *this_01;
  int iVar8;
  int iVar9;
  Symbol pGVar10;
  GdlNumericExpression *pGVar11;
  Symbol pGVar12;
  GdlObject *pGVar13;
  gid16 wGlyphID_00;
  undefined6 in_register_00000012;
  int iVar14;
  bool bVar15;
  bool fOverride;
  int munitPRx;
  bool fShadowY;
  bool fShadowX;
  int nPRx;
  GdlGlyphDefn *local_220;
  GdlExpression *pexpX;
  int nY;
  int munitPRy;
  int nPRy;
  int nX;
  ulong local_200;
  GdlExpression *pexpGpoint;
  GrpLineAndFile lnf;
  GdlExpression *pexpY;
  int local_1bc;
  GrcFont *local_1b8;
  vector<GdlExpression*,std::allocator<GdlExpression*>> *local_1b0;
  int local_1a4;
  ulong local_1a0;
  ulong local_198;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  long *local_90;
  size_t local_88;
  long local_80 [2];
  string local_70;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  iVar14 = (int)((ulong)((long)(this->m_vpsymStyles).
                               super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_vpsymStyles).
                              super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  local_1a4 = 1;
  if (1 < iVar14) {
    local_1a4 = iVar14;
  }
  local_1bc = ActualForPseudo(this,wGlyphID);
  if (local_1bc == 0) {
    local_1bc = (int)CONCAT62(in_register_00000012,wGlyphID);
  }
  if ((this->m_vpsymGlyphAttrs).
      super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->m_vpsymGlyphAttrs).
      super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_1b0 = (vector<GdlExpression*,std::allocator<GdlExpression*>> *)&this->m_vpexpModified;
    local_220 = (GdlGlyphDefn *)(ulong)wGlyphID;
    local_200 = 0;
    iVar14 = local_1a4;
    local_1b8 = pfont;
    do {
      this_00 = (this->m_vpsymGlyphAttrs).
                super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>.
                _M_impl.super__Vector_impl_data._M_start[local_200];
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"x","");
      sVar2 = (this_00->m_staFieldName)._M_string_length;
      if (sVar2 == local_48) {
        if (sVar2 == 0) {
          bVar15 = true;
        }
        else {
          iVar8 = bcmp((this_00->m_staFieldName)._M_dataplus._M_p,local_50,sVar2);
          bVar15 = iVar8 == 0;
        }
      }
      else {
        bVar15 = false;
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      if (bVar15) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"y","");
        pGVar10 = GrcSymbolTableEntry::PointSisterField(this_00,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if (pGVar10 != (Symbol)0x0) {
          iVar8 = pGVar10->m_nInternalID;
          lnf.m_nLinePre = -1;
          lnf.m_nLineOrig = -1;
          lnf.m_staFile._M_dataplus._M_p = (pointer)&lnf.m_staFile.field_2;
          lnf.m_staFile._M_string_length = 0;
          lnf.m_staFile.field_2._M_local_buf[0] = '\0';
          GrcGlyphAttrMatrix::Get
                    (this->m_pgax,(gid16)local_220,(int)local_200,0,&pexpX,&nPRx,&munitPRx,
                     &fOverride,&fShadowX,&lnf);
          if (((((pexpX != (GdlExpression *)0x0) &&
                (iVar9 = (*pexpX->_vptr_GdlExpression[7])(pexpX,&nX,0), (char)iVar9 != '\0')) &&
               (GrcGlyphAttrMatrix::Get
                          (this->m_pgax,(gid16)local_220,iVar8,0,&pexpY,&nPRy,&munitPRy,&fOverride,
                           &fShadowY,&lnf), pexpY != (GdlExpression *)0x0)) &&
              ((iVar9 = (*pexpY->_vptr_GdlExpression[7])(pexpY,&nY,0), (char)iVar9 != '\0' &&
               (fShadowX == false)))) && (fShadowY == false)) {
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"gpoint","");
            pGVar10 = GrcSymbolTableEntry::PointSisterField(this_00,&local_f0);
            this_01 = local_1b8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
            nPRx = GrcFont::ScaledToAbsolute(this_01,nPRx,munitPRx);
            nPRy = GrcFont::ScaledToAbsolute(this_01,nPRy,munitPRy);
            iVar9 = nPRy;
            if (nPRy < nPRx) {
              iVar9 = nPRx;
            }
            pGVar13 = &pexpX->super_GdlObject;
            if (pexpX == (GdlExpression *)0x0) {
              pGVar13 = (GdlObject *)0x0;
            }
            gVar7 = (gid16)local_1bc;
            iVar9 = GrcFont::GetPointAtXY(this_01,(gid16)local_1bc,nX,nY,iVar9,pGVar13);
            if (-1 < iVar9) {
              pGVar13 = &pexpX->super_GdlObject;
              if (pexpX == (GdlExpression *)0x0) {
                pGVar13 = (GdlObject *)0x0;
              }
              bVar15 = GrcFont::IsPointAlone(local_1b8,gVar7,iVar9,pGVar13);
              if (!bVar15) {
                pGVar11 = (GdlNumericExpression *)operator_new(0x40);
                GdlNumericExpression::GdlNumericExpression(pGVar11,iVar9);
                iVar9 = (pexpX->super_GdlObject).m_lnf.m_nLineOrig;
                *(int *)&pGVar11->field_0x8 = (pexpX->super_GdlObject).m_lnf.m_nLinePre;
                *(int *)&pGVar11->field_0xc = iVar9;
                pexpGpoint = (GdlExpression *)pGVar11;
                std::__cxx11::string::_M_assign((string *)&pGVar11->field_0x10);
                iVar3._M_current =
                     (this->m_vpexpModified).
                     super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar3._M_current ==
                    (this->m_vpexpModified).
                    super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<GdlExpression*,std::allocator<GdlExpression*>>::
                  _M_realloc_insert<GdlExpression*const&>(local_1b0,iVar3,&pexpGpoint);
                }
                else {
                  *iVar3._M_current = pexpGpoint;
                  pppGVar1 = &(this->m_vpexpModified).
                              super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish;
                  *pppGVar1 = *pppGVar1 + 1;
                }
                GrcGlyphAttrMatrix::Set
                          (this->m_pgax,(gid16)local_220,pGVar10->m_nInternalID,0,pexpGpoint,0,
                           munitPRx,fOverride,false,&lnf);
                GrcGlyphAttrMatrix::Set
                          (this->m_pgax,(gid16)local_220,(int)local_200,0,(GdlExpression *)0x0,0,
                           munitPRx,true,false,&lnf);
                GrcGlyphAttrMatrix::Set
                          (this->m_pgax,(gid16)local_220,iVar8,0,(GdlExpression *)0x0,0,munitPRy,
                           true,false,&lnf);
              }
            }
          }
LAB_0012f1c6:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)lnf.m_staFile._M_dataplus._M_p != &lnf.m_staFile.field_2) {
            operator_delete(lnf.m_staFile._M_dataplus._M_p,
                            CONCAT71(lnf.m_staFile.field_2._M_allocated_capacity._1_7_,
                                     lnf.m_staFile.field_2._M_local_buf[0]) + 1);
          }
        }
      }
      else {
        local_90 = local_80;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"gpoint","");
        sVar2 = (this_00->m_staFieldName)._M_string_length;
        if (sVar2 == local_88) {
          if (sVar2 == 0) {
            bVar15 = true;
          }
          else {
            iVar8 = bcmp((this_00->m_staFieldName)._M_dataplus._M_p,local_90,sVar2);
            bVar15 = iVar8 == 0;
          }
        }
        else {
          bVar15 = false;
        }
        if (local_90 != local_80) {
          operator_delete(local_90,local_80[0] + 1);
        }
        if (bVar15) {
          lnf.m_nLinePre = -1;
          lnf.m_nLineOrig = -1;
          lnf.m_staFile._M_dataplus._M_p = (pointer)&lnf.m_staFile.field_2;
          lnf.m_staFile._M_string_length = 0;
          lnf.m_staFile.field_2._M_local_buf[0] = '\0';
          GrcGlyphAttrMatrix::Get
                    (this->m_pgax,(gid16)local_220,(int)local_200,0,&pexpX,&nPRx,&munitPRx,
                     (bool *)&nY,&fOverride,&lnf);
          if ((pexpX != (GdlExpression *)0x0) &&
             (iVar8 = (*pexpX->_vptr_GdlExpression[7])(pexpX,&nX,0), (char)iVar8 != '\0')) {
            pGVar13 = &pexpX->super_GdlObject;
            if (pexpX == (GdlExpression *)0x0) {
              pGVar13 = (GdlObject *)0x0;
            }
            gVar7 = (gid16)local_1bc;
            iVar8 = GrcFont::GetXYAtPoint(local_1b8,(gid16)local_1bc,nX,&nPRy,&munitPRy,pGVar13);
            if (iVar8 != 0) {
              local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"x","");
              pGVar10 = GrcSymbolTableEntry::PointSisterField(this_00,&local_110);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p != &local_110.field_2) {
                operator_delete(local_110._M_dataplus._M_p,
                                local_110.field_2._M_allocated_capacity + 1);
              }
              local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"y","");
              pGVar12 = GrcSymbolTableEntry::PointSisterField(this_00,&local_130);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_130._M_dataplus._M_p != &local_130.field_2) {
                operator_delete(local_130._M_dataplus._M_p,
                                local_130.field_2._M_allocated_capacity + 1);
              }
              local_198 = (ulong)(uint)pGVar10->m_nInternalID;
              local_1a0 = (ulong)(uint)pGVar12->m_nInternalID;
              pGVar11 = (GdlNumericExpression *)operator_new(0x40);
              GdlNumericExpression::GdlNumericExpression(pGVar11,nPRy,-2);
              iVar8 = (pexpX->super_GdlObject).m_lnf.m_nLineOrig;
              *(int *)&pGVar11->field_0x8 = (pexpX->super_GdlObject).m_lnf.m_nLinePre;
              *(int *)&pGVar11->field_0xc = iVar8;
              pexpY = (GdlExpression *)pGVar11;
              std::__cxx11::string::_M_assign((string *)&pGVar11->field_0x10);
              pGVar11 = (GdlNumericExpression *)operator_new(0x40);
              GdlNumericExpression::GdlNumericExpression(pGVar11,munitPRy,-2);
              iVar8 = (pexpX->super_GdlObject).m_lnf.m_nLineOrig;
              *(int *)&pGVar11->field_0x8 = (pexpX->super_GdlObject).m_lnf.m_nLinePre;
              *(int *)&pGVar11->field_0xc = iVar8;
              pexpGpoint = (GdlExpression *)pGVar11;
              std::__cxx11::string::_M_assign((string *)&pGVar11->field_0x10);
              iVar3._M_current =
                   (this->m_vpexpModified).
                   super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (this->m_vpexpModified).
                  super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<GdlExpression*,std::allocator<GdlExpression*>>::
                _M_realloc_insert<GdlExpression*const&>(local_1b0,iVar3,&pexpY);
              }
              else {
                *iVar3._M_current = pexpY;
                pppGVar1 = &(this->m_vpexpModified).
                            super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
                *pppGVar1 = *pppGVar1 + 1;
              }
              iVar3._M_current =
                   (this->m_vpexpModified).
                   super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (this->m_vpexpModified).
                  super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<GdlExpression*,std::allocator<GdlExpression*>>::
                _M_realloc_insert<GdlExpression*const&>(local_1b0,iVar3,&pexpGpoint);
              }
              else {
                *iVar3._M_current = pexpGpoint;
                pppGVar1 = &(this->m_vpexpModified).
                            super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
                *pppGVar1 = *pppGVar1 + 1;
              }
              pGVar4 = this->m_pgax;
              sVar5 = pGVar4->m_cGlyphAttrs;
              bVar15 = pGVar4->m_cGlyphIDs != 0;
              sVar6 = pGVar4->m_cStyles;
              if (sVar6 != 0 && (bVar15 && sVar5 != 0)) {
                if (((sVar6 != 0 && (bVar15 && sVar5 != 0)) &&
                     pGVar4->m_prgasgnx[((int)sVar5 * (int)local_220 + (int)local_198) * (int)sVar6]
                     .m_pexp != (GdlExpression *)0x0) &&
                   (pGVar4->m_prgasgnx[(int)sVar6 * ((int)sVar5 * (int)local_220 + (int)local_1a0)].
                    m_pexp != (GdlExpression *)0x0)) {
                  pGVar10 = GrcSymbolTableEntry::BasePoint(this_00);
                  pGVar13 = &pexpX->super_GdlObject;
                  if (pexpX == (GdlExpression *)0x0) {
                    pGVar13 = (GdlObject *)0x0;
                  }
                  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_170,"Both x/y coordinates and gpoint are defined for "
                             ,"");
                  GrcSymbolTableEntry::FullName_abi_cxx11_(&local_b0,pGVar10);
                  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_190," for glyph ","");
                  GdlGlyphDefn::GlyphIDString_abi_cxx11_(&local_d0,local_220,wGlyphID_00);
                  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_150,"; only gpoint will be used","");
                  GrcErrorList::AddItem
                            (&g_errorList,false,0x11a1,pGVar13,(GrpLineAndFile *)0x0,&local_170,
                             &local_b0,&local_190,&local_d0,&local_150,(string *)0x0,(string *)0x0,
                             (string *)0x0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_150._M_dataplus._M_p != &local_150.field_2) {
                    operator_delete(local_150._M_dataplus._M_p,
                                    local_150.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                    operator_delete(local_d0._M_dataplus._M_p,
                                    local_d0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_190._M_dataplus._M_p != &local_190.field_2) {
                    operator_delete(local_190._M_dataplus._M_p,
                                    local_190.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                    operator_delete(local_b0._M_dataplus._M_p,
                                    local_b0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_170._M_dataplus._M_p != &local_170.field_2) {
                    operator_delete(local_170._M_dataplus._M_p,
                                    local_170.field_2._M_allocated_capacity + 1);
                  }
                }
              }
              pGVar13 = &pexpX->super_GdlObject;
              if (pexpX == (GdlExpression *)0x0) {
                pGVar13 = (GdlObject *)0x0;
              }
              bVar15 = GrcFont::IsPointAlone(local_1b8,gVar7,nX,pGVar13);
              GrcGlyphAttrMatrix::Set
                        (this->m_pgax,(gid16)local_220,(int)local_198,0,pexpY,nPRx,munitPRx,nY._0_1_
                         ,!bVar15,&lnf);
              GrcGlyphAttrMatrix::Set
                        (this->m_pgax,(gid16)local_220,(int)local_1a0,0,pexpGpoint,nPRx,munitPRx,
                         nY._0_1_,!bVar15,&lnf);
              if (bVar15) {
                GrcGlyphAttrMatrix::Set
                          (this->m_pgax,(gid16)local_220,(int)local_200,0,(GdlExpression *)0x0,0,
                           munitPRx,true,false,&lnf);
              }
            }
          }
          goto LAB_0012f1c6;
        }
      }
      iVar14 = iVar14 + -1;
    } while ((iVar14 != 0) ||
            (local_200 = (ulong)((int)local_200 + 1), iVar14 = local_1a4,
            local_200 <
            (ulong)((long)(this->m_vpsymGlyphAttrs).
                          super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_vpsymGlyphAttrs).
                          super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3)));
  }
  return;
}

Assistant:

void GrcManager::ConvertBetweenXYAndGpoint(GrcFont * pfont, gid16 wGlyphID)
{
	int cStdStyles = max(signed(m_vpsymStyles.size()), 1);
	utf16 wActual = ActualForPseudo(wGlyphID);
	if (wActual == 0)
		wActual = wGlyphID;

	for (auto iAttrID = 0U; iAttrID < m_vpsymGlyphAttrs.size(); ++iAttrID)
	{
		for (auto n = cStdStyles; n; --n)
		{
			Symbol psymAttr = m_vpsymGlyphAttrs[iAttrID];

			if (psymAttr->LastFieldIs("x"))
			{
				Symbol psymAttrX = psymAttr;
				Symbol psymAttrY = psymAttrX->PointSisterField("y");
				if (!psymAttrY)
					continue; // need both x and y to convert
				int iAttrIDx = iAttrID;
				int iAttrIDy = psymAttrY->InternalID();

				GdlExpression * pexpX;
				int nPRx;
				int munitPRx;
				bool fOverride, fShadowX, fShadowY;
				GrpLineAndFile lnf;
				m_pgax->Get(wGlyphID, iAttrIDx,
					&pexpX, &nPRx, &munitPRx, &fOverride, &fShadowX, &lnf);

				if (!pexpX)
					continue;
				int nX;
				if (!pexpX->ResolveToInteger(&nX, false))
					continue;

				GdlExpression * pexpY;
				int nPRy;
				int munitPRy;
				m_pgax->Get(wGlyphID, iAttrIDy,
					&pexpY, &nPRy, &munitPRy, &fOverride, &fShadowY, &lnf);

				if (!pexpY)
					continue;
				int nY;
				if (!pexpY->ResolveToInteger(&nY, false))
					continue;

				Assert(fShadowX == fShadowY);
				if (fShadowX || fShadowY)
					continue;

				//	Find the corresponding gpoint attribute.
				Symbol psymGPoint = psymAttrX->PointSisterField("gpoint");
				Assert(psymGPoint);

				nPRx = pfont->ScaledToAbsolute(nPRx, munitPRx);
				nPRy = pfont->ScaledToAbsolute(nPRy, munitPRy);

				//	See if we can find a corresponding on-curve point.
				int nGPointValue = pfont->GetPointAtXY(wActual, nX, nY, max(nPRx, nPRy), pexpX);
				if (nGPointValue > -1 && !pfont->IsPointAlone(wActual, nGPointValue, pexpX))
				{
					//	We found one. Set the value of the gpoint field.
					GdlExpression * pexpGpoint = new GdlNumericExpression(nGPointValue);
					pexpGpoint->CopyLineAndFile(*pexpX);

					m_vpexpModified.push_back(pexpGpoint);	// so we can delete it later
					m_pgax->Set(wGlyphID, psymGPoint->InternalID(),
						pexpGpoint, 0, munitPRx, fOverride, false, lnf);

					//	Clear the x and y fields.
					m_pgax->Set(wGlyphID, iAttrIDx, NULL, 0, munitPRx, true, false, lnf);
					m_pgax->Set(wGlyphID, iAttrIDy, NULL, 0, munitPRy, true, false, lnf);

					//	Don't delete the actual expressions, because they are owned by the
					//	original assignment statements, which will delete them.
				}
			}
			else if (psymAttr->LastFieldIs("gpoint"))
			{
				Symbol psymAttrGpoint = psymAttr;

				int iAttrIDgpoint = iAttrID;
				GdlExpression * pexpGpoint;
				int nPR;
				int munitPR;
				bool fOverride, fShadow;
				GrpLineAndFile lnf;
				m_pgax->Get(wGlyphID, iAttrIDgpoint,
					&pexpGpoint, &nPR, &munitPR, &fOverride, &fShadow, &lnf);
				Assert(!fShadow);

				if (!pexpGpoint)
					continue;
				int nGPoint;
				if (!pexpGpoint->ResolveToInteger(&nGPoint, false))
					continue;

				//	Convert gpoint to x/y. On Linux gpoint will never work.
				//	It won't work on Windows either if the point comprises a single-point path,
				//	so in that case, delete the gpoint setting altogether. In other cases,
				//	leave both around, so if gpoint doesn't work, the engine can fall back
				//	to x/y.
				int mX, mY;
				if (pfont->GetXYAtPoint(wActual, nGPoint, &mX, &mY, pexpGpoint))
				{
					//	Create equivalent x/y statements.

					Symbol psymX = psymAttrGpoint->PointSisterField("x");
					Symbol psymY = psymAttrGpoint->PointSisterField("y");
					Assert(psymX);
					Assert(psymY);
					int nIDX = psymX->InternalID();
					int nIDY = psymY->InternalID();

					GdlExpression * pexpX = new GdlNumericExpression(mX, kmunitUnscaled);
					pexpX->CopyLineAndFile(*pexpGpoint);

					GdlExpression * pexpY = new GdlNumericExpression(mY, kmunitUnscaled);
					pexpY->CopyLineAndFile(*pexpGpoint);

					m_vpexpModified.push_back(pexpX);	// so we can delete them later
					m_vpexpModified.push_back(pexpY);

					if (m_pgax->Defined(wGlyphID, nIDX) && m_pgax->Defined(wGlyphID, nIDY))
					{
						Symbol psymBasePt = psymAttr->BasePoint();
						g_errorList.AddWarning(4513, pexpGpoint,
							"Both x/y coordinates and gpoint are defined for ",
							psymBasePt->FullName(),
							" for glyph ",
							GdlGlyphDefn::GlyphIDString(wGlyphID),
							"; only gpoint will be used");
					}

					bool fDeleteGpoint = pfont->IsPointAlone(wActual, nGPoint, pexpGpoint);

					// Store the new expressions as glyph attribute assignments.
					m_pgax->Set(wGlyphID, nIDX, pexpX, nPR, munitPR,
						fOverride, !fDeleteGpoint, lnf);
					m_pgax->Set(wGlyphID, nIDY, pexpY, nPR, munitPR,
						fOverride, !fDeleteGpoint, lnf);

					if (fDeleteGpoint)
					{
						//	Since this is a single-point path, it won't show up in the
						//	hinted glyph from the graphics object, so we really have to
						//	use the x/y coordinates. So clear the gpoint field.
						m_pgax->Set(wGlyphID, iAttrIDgpoint, NULL, 0, munitPR, true, false, lnf);
					}

					//	Don't delete the actual expression, because it is owned by the
					//	original assignment statements, which will delete it.
				}
			}
		}
	}
}